

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.h
# Opt level: O0

uint bloaty::ReadFixed<unsigned_int,3ul>(string_view *data)

{
  size_type sVar1;
  uint3 *puVar2;
  basic_string_view<char,_std::char_traits<char>_> *in_RDI;
  char *unaff_retaddr;
  uint val;
  undefined4 local_c;
  
  sVar1 = std::basic_string_view<char,_std::char_traits<char>_>::size(in_RDI);
  if (sVar1 < 3) {
    Throw(unaff_retaddr,(int)((ulong)in_RDI >> 0x20));
  }
  puVar2 = (uint3 *)std::basic_string_view<char,_std::char_traits<char>_>::data(in_RDI);
  local_c = (uint)*puVar2;
  std::basic_string_view<char,_std::char_traits<char>_>::remove_prefix(in_RDI,3);
  return local_c;
}

Assistant:

T ReadFixed(std::string_view *data) {
  static_assert(N <= sizeof(T), "N too big for this data type");
  T val = 0;
  if (data->size() < N) {
    THROW("premature EOF reading fixed-length data");
  }
  memcpy(&val, data->data(), N);
  data->remove_prefix(N);
  return val;
}